

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismSearcher::propagate_adjacency_constraints<true,true,true,false>
          (HomomorphismSearcher *this,HomomorphismDomain *d,
          HomomorphismAssignment *current_assignment)

{
  int iVar1;
  long in_RSI;
  SVOBitset *in_RDI;
  int got_reverse_label;
  uint c_1;
  int want_reverse_label;
  SVOBitset check_d_values_1;
  PatternAdjacencyBitsType *reverse_edge_graph_pairs_to_consider_1;
  int got_forward_label;
  uint c;
  int want_forward_label;
  SVOBitset check_d_values;
  uint g;
  PatternAdjacencyBitsType *reverse_edge_graph_pairs_to_consider;
  conditional_t<false,_SVOBitset,_tuple<>_> before;
  PatternAdjacencyBitsType *graph_pairs_to_consider;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  int in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int iVar2;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  SVOBitset *in_stack_fffffffffffffe60;
  SVOBitset *in_stack_fffffffffffffe68;
  uint local_180;
  byte local_e9;
  byte *local_e8;
  int local_dc;
  uint local_d8;
  int local_c4;
  uint local_38;
  byte local_31;
  byte *local_30;
  byte local_21;
  byte *local_20;
  long local_10;
  
  local_10 = in_RSI;
  local_21 = HomomorphismModel::pattern_adjacency_bits
                       ((HomomorphismModel *)
                        CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                        in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
  local_20 = &local_21;
  if ((local_21 & 1) == 0) {
    in_stack_fffffffffffffe68 = (SVOBitset *)(local_10 + 0x10);
    HomomorphismModel::forward_target_graph_row
              ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe4c);
    SVOBitset::intersect_with_complement
              (in_stack_fffffffffffffe60,
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  else {
    HomomorphismModel::forward_target_graph_row
              ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe4c);
    SVOBitset::operator&=
              (in_stack_fffffffffffffe60,
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  local_31 = HomomorphismModel::pattern_adjacency_bits
                       ((HomomorphismModel *)
                        CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                        in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
  local_30 = &local_31;
  if ((local_31 & 1) == 0) {
    in_stack_fffffffffffffe60 = (SVOBitset *)(local_10 + 0x10);
    HomomorphismModel::reverse_target_graph_row
              ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe4c);
    SVOBitset::intersect_with_complement
              (in_stack_fffffffffffffe60,
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  else {
    HomomorphismModel::reverse_target_graph_row
              ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe4c);
    SVOBitset::operator&=
              (in_stack_fffffffffffffe60,
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  }
  for (local_38 = 1; local_38 < *(uint *)((in_RDI->_data).short_data[0] + 8);
      local_38 = local_38 + 1) {
    if (((uint)*local_20 & 1 << ((byte)local_38 & 0x1f)) != 0) {
      HomomorphismModel::target_graph_row
                ((HomomorphismModel *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
      SVOBitset::operator&=
                (in_stack_fffffffffffffe60,
                 (SVOBitset *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
  }
  if ((*local_20 & 1) != 0) {
    SVOBitset::SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    local_c4 = HomomorphismModel::pattern_edge_label
                         ((HomomorphismModel *)
                          CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                          in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
    local_d8 = SVOBitset::find_first(in_stack_fffffffffffffe68);
    while (local_d8 != 0xffffffff) {
      SVOBitset::reset(in_RDI,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      local_dc = HomomorphismModel::target_edge_label
                           ((HomomorphismModel *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
      if (local_dc != local_c4) {
        SVOBitset::reset(in_RDI,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      }
      local_d8 = SVOBitset::find_first(in_stack_fffffffffffffe68);
    }
    SVOBitset::~SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  }
  local_e9 = HomomorphismModel::pattern_adjacency_bits
                       ((HomomorphismModel *)
                        CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                        in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
  local_e8 = &local_e9;
  if ((local_e9 & 1) != 0) {
    SVOBitset::SVOBitset
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               (SVOBitset *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    iVar1 = HomomorphismModel::pattern_edge_label
                      ((HomomorphismModel *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
    iVar2 = iVar1;
    local_180 = SVOBitset::find_first(in_stack_fffffffffffffe68);
    while (local_180 != 0xffffffff) {
      SVOBitset::reset(in_RDI,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      in_stack_fffffffffffffe50 =
           HomomorphismModel::target_edge_label
                     ((HomomorphismModel *)CONCAT44(iVar2,in_stack_fffffffffffffe50),
                      in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
      if (in_stack_fffffffffffffe50 != iVar1) {
        SVOBitset::reset(in_RDI,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      }
      local_180 = SVOBitset::find_first(in_stack_fffffffffffffe68);
    }
    SVOBitset::~SVOBitset((SVOBitset *)CONCAT44(iVar2,in_stack_fffffffffffffe50));
  }
  return;
}

Assistant:

auto HomomorphismSearcher::propagate_adjacency_constraints(HomomorphismDomain & d, const HomomorphismAssignment & current_assignment) -> void
{
    const auto & graph_pairs_to_consider = model.pattern_adjacency_bits(current_assignment.pattern_vertex, d.v);

    [[maybe_unused]] conditional_t<verbose_proofs_, SVOBitset, tuple<>> before;
    if constexpr (verbose_proofs_) {
        before = d.values;
    }

    if constexpr (! directed_) {
        // for the original graph pair, if we're adjacent...
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(0, current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.target_graph_row(0, current_assignment.target_vertex));
            }
        }
    }
    else {
        // both forward and reverse edges to consider
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.forward_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.forward_target_graph_row(current_assignment.target_vertex));
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);

        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.reverse_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.reverse_target_graph_row(current_assignment.target_vertex));
            }
        }
    }

    if constexpr (verbose_proofs_) {
        if (before.count() != d.values.count())
            proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                0, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
        before = d.values;
    }

    // and for each remaining graph pair...
    for (unsigned g = 1; g < model.max_graphs; ++g) {
        // if we're adjacent...
        if (graph_pairs_to_consider & (1u << g)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(g, current_assignment.target_vertex);
        }

        if constexpr (verbose_proofs_) {
            if (before.count() != d.values.count())
                proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                    g, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
            before = d.values;
        }
    }

    if constexpr (has_edge_labels_) {
        // if we're adjacent in the original graph, additionally the edge labels need to match up
        if (graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_forward_label = model.pattern_edge_label(current_assignment.pattern_vertex, d.v);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_forward_label = model.target_edge_label(current_assignment.target_vertex, c);
                if (got_forward_label != want_forward_label)
                    d.values.reset(c);
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);
        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_reverse_label = model.pattern_edge_label(d.v, current_assignment.pattern_vertex);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_reverse_label = model.target_edge_label(c, current_assignment.target_vertex);
                if (got_reverse_label != want_reverse_label)
                    d.values.reset(c);
            }
        }
    }
}